

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateCopyConstructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor FVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  Formatter format;
  Formatter local_50;
  
  local_50.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_50.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  (*(this->super_FieldGenerator)._vptr_FieldGenerator[0xf])(this,printer);
  pFVar2 = (this->super_FieldGenerator).descriptor_;
  FVar1 = pFVar2[1];
  if (((byte)FVar1 & 2) == 0) {
    if ((((byte)FVar1 & 0x60) == 0x20) && (*(char *)(*(long *)(pFVar2 + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar1 & 0x10) == 0) || (*(long *)(pFVar2 + 0x28) == 0)) goto LAB_002ebbba;
    }
    else if (((byte)FVar1 & 0x60) == 0x40) goto LAB_002ebbba;
    pcVar3 = "if (!from._internal_$name$().empty()) {\n";
  }
  else {
LAB_002ebbba:
    pcVar3 = "if (from._internal_has_$name$()) {\n";
    if (*(char *)(*(long *)(pFVar2 + 0x38) + 0x4f) != '\0') {
      pcVar3 = "if (!from._internal_$name$().empty()) {\n";
    }
  }
  Formatter::operator()<>(&local_50,pcVar3);
  io::Printer::Indent(local_50.printer_);
  pcVar3 = 
  "$name$_.Set($default_value_tag$, from._internal_$name$(), \n  GetArenaForAllocation());\n";
  if (this->inlined_ != false) {
    pcVar3 = 
    "$name$_.Set(nullptr, from._internal_$name$(),\n  GetArenaForAllocation(), _internal_$name$_donated(), &$donating_states_word$, $mask_for_undonate$);\n"
    ;
  }
  Formatter::operator()<>(&local_50,pcVar3);
  io::Printer::Outdent(local_50.printer_);
  Formatter::operator()<>(&local_50,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateCopyConstructorCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  GenerateConstructorCode(printer);

  if (HasHasbit(descriptor_)) {
    format("if (from._internal_has_$name$()) {\n");
  } else {
    format("if (!from._internal_$name$().empty()) {\n");
  }

  format.Indent();

  if (!inlined_) {
    format(
        "$name$_.Set($default_value_tag$, from._internal_$name$(), \n"
        "  GetArenaForAllocation());\n");
  } else {
    format(
        "$name$_.Set(nullptr, from._internal_$name$(),\n"
        "  GetArenaForAllocation(), _internal_$name$_donated(), "
        "&$donating_states_word$, $mask_for_undonate$);\n");
  }

  format.Outdent();
  format("}\n");
}